

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O2

InputIterator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_11UL,_void>
__thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
::getDataIterator(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                  *this)

{
  unsigned_long extraout_RDX;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>>
  *in_RSI;
  InputIterator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_11UL,_void>
  IVar1;
  undefined1 local_78 [56];
  string local_40;
  
  getFileManager((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                  *)local_78);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>>
  ::getStorageFilePath_abi_cxx11_(&local_40,in_RSI);
  std::filesystem::__cxx11::path::path((path *)(local_78 + 0x10),&local_40,auto_format);
  io::FileManager::
  getInputIterator<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long>
            ((FileManager *)this,(path *)local_78._0_8_,(uint64_t)(local_78 + 0x10));
  std::filesystem::__cxx11::path::~path((path *)(local_78 + 0x10));
  std::__cxx11::string::~string((string *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  IVar1.index_ = extraout_RDX;
  IVar1.input_._M_t.
  super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>.
  _M_t.
  super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
  .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
        )(__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
          )this;
  return IVar1;
}

Assistant:

io::InputIterator<T, IndexT> getDataIterator() const {
        return getFileManager()->template getInputIterator<T, IndexT>(getStorageFilePath(), 0);
    }